

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Flatten_x86::forward(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float *pfVar13;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  undefined8 in_RDI;
  int _w;
  int i_2;
  float *outptr;
  float *ptr_2;
  int q_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int i_1;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *ptr_1;
  int q;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3;
  __m128 _row2;
  __m128 _row1;
  __m128 _row0;
  int j;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *ptr;
  int i;
  size_t out_elemsize;
  int out_elempack;
  int total;
  int size;
  int elempack;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  int elembits;
  Mat *in_stack_fffffffffffffa10;
  Mat *in_stack_fffffffffffffa18;
  Mat *this_00;
  size_t in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa34;
  Mat *in_stack_fffffffffffffa38;
  Mat local_5c0;
  float *local_578;
  int local_56c;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_508;
  undefined8 uStack_500;
  int local_4e4;
  float *local_4e0;
  float *local_4d8;
  float *local_4d0;
  float *local_4c8;
  Mat local_4b0;
  float *local_468;
  int local_45c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  int local_3cc;
  float *local_3c8;
  float *local_3c0;
  float *local_3b8;
  float *local_3b0;
  float *local_3a8;
  int local_39c;
  int local_390;
  int local_33c;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2e4;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2a4;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_25c;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_23c;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_21c;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  
  _w = (int)((ulong)in_RDI >> 0x20);
  iVar10 = ncnn::Mat::elembits(in_RSI);
  if (iVar10 == 8) {
    local_33c = forward_int8((Flatten_x86 *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                             (Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                             (Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                             (Option *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0)
                            );
  }
  else {
    iVar10 = in_RSI->dims;
    if (iVar10 == 1) {
      ncnn::Mat::operator=(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      local_33c = 0;
    }
    else {
      iVar1 = in_RSI->w;
      iVar2 = in_RSI->h;
      iVar3 = in_RSI->c;
      uVar5 = in_RSI->elemsize;
      iVar4 = in_RSI->elempack;
      iVar11 = iVar1 * iVar2 * in_RSI->d;
      iVar12 = iVar11 * iVar3 * iVar4;
      local_390 = 1;
      if (((*(byte *)(in_RCX + 0x27) & 1) != 0) && (local_390 = 1, iVar12 % 4 == 0)) {
        local_390 = 4;
      }
      if (local_390 == 1) {
        local_33c = Flatten::forward((Flatten *)
                                     CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                     (Mat *)CONCAT44(in_stack_fffffffffffffab4,
                                                     in_stack_fffffffffffffab0),
                                     (Mat *)CONCAT44(in_stack_fffffffffffffaac,
                                                     in_stack_fffffffffffffaa8),
                                     (Option *)
                                     CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      }
      else if ((iVar10 == 2) && (iVar4 == 1)) {
        ncnn::Mat::operator=(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
        in_RDX->dims = 1;
        in_RDX->w = iVar12 / local_390;
        in_RDX->h = 1;
        in_RDX->cstep = (long)in_RDX->w;
        in_RDX->elemsize = (uVar5 / (ulong)(long)iVar4) * (long)local_390;
        in_RDX->elempack = local_390;
        local_33c = 0;
      }
      else {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),_w,
                          in_stack_fffffffffffffa20,(int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                          (Allocator *)in_stack_fffffffffffffa10);
        bVar9 = ncnn::Mat::empty(in_stack_fffffffffffffa10);
        if (bVar9) {
          local_33c = -100;
        }
        else {
          if ((iVar10 == 2) && (iVar4 == 4)) {
            for (local_39c = 0; local_39c < iVar2; local_39c = local_39c + 1) {
              local_3a8 = ncnn::Mat::row(in_RSI,local_39c);
              local_3b0 = ncnn::Mat::operator_cast_to_float_(in_RDX);
              local_3b0 = local_3b0 + iVar1 * local_39c * 4;
              local_3b8 = ncnn::Mat::operator_cast_to_float_(in_RDX);
              local_3b8 = local_3b8 + iVar1 * (local_39c * 4 + 1);
              local_3c0 = ncnn::Mat::operator_cast_to_float_(in_RDX);
              local_3c0 = local_3c0 + iVar1 * (local_39c * 4 + 2);
              local_3c8 = ncnn::Mat::operator_cast_to_float_(in_RDX);
              local_3c8 = local_3c8 + iVar1 * (local_39c * 4 + 3);
              for (local_3cc = 0; local_3cc + 3 < iVar1; local_3cc = local_3cc + 4) {
                uVar6 = *(undefined8 *)(local_3a8 + 8);
                uVar7 = *(undefined8 *)(local_3a8 + 10);
                local_288 = (undefined4)*(undefined8 *)local_3a8;
                local_458 = local_288;
                uStack_284 = (undefined4)((ulong)*(undefined8 *)local_3a8 >> 0x20);
                uStack_450 = uStack_284;
                local_298 = (undefined4)*(undefined8 *)(local_3a8 + 4);
                uStack_454 = local_298;
                uStack_294 = (undefined4)((ulong)*(undefined8 *)(local_3a8 + 4) >> 0x20);
                uStack_44c = uStack_294;
                uStack_2a4 = (undefined4)((ulong)uVar6 >> 0x20);
                local_2b8 = (undefined4)*(undefined8 *)(local_3a8 + 0xc);
                uStack_2b4 = (undefined4)((ulong)*(undefined8 *)(local_3a8 + 0xc) >> 0x20);
                uStack_200 = (undefined4)*(undefined8 *)(local_3a8 + 2);
                local_448 = uStack_200;
                uStack_1fc = (undefined4)((ulong)*(undefined8 *)(local_3a8 + 2) >> 0x20);
                uStack_210 = (undefined4)*(undefined8 *)(local_3a8 + 6);
                uStack_444 = uStack_210;
                uStack_20c = (undefined4)((ulong)*(undefined8 *)(local_3a8 + 6) >> 0x20);
                uStack_21c = (undefined4)((ulong)uVar7 >> 0x20);
                uStack_230 = (undefined4)*(undefined8 *)(local_3a8 + 0xe);
                uStack_22c = (undefined4)((ulong)*(undefined8 *)(local_3a8 + 0xe) >> 0x20);
                local_3f8 = CONCAT44(uStack_294,uStack_284);
                uStack_3f0 = CONCAT44(uStack_2b4,uStack_2a4);
                local_418 = CONCAT44(uStack_20c,uStack_1fc);
                uStack_410 = CONCAT44(uStack_22c,uStack_21c);
                *(ulong *)local_3b0 = CONCAT44(local_298,local_288);
                *(ulong *)(local_3b0 + 2) = CONCAT44(local_2b8,(int)uVar6);
                *(undefined8 *)local_3b8 = local_3f8;
                *(undefined8 *)(local_3b8 + 2) = uStack_3f0;
                *(ulong *)local_3c0 = CONCAT44(uStack_210,uStack_200);
                *(ulong *)(local_3c0 + 2) = CONCAT44(uStack_230,(int)uVar7);
                *(undefined8 *)local_3c8 = local_418;
                *(undefined8 *)(local_3c8 + 2) = uStack_410;
                local_3a8 = local_3a8 + 0x10;
                local_3b0 = local_3b0 + 4;
                local_3b8 = local_3b8 + 4;
                local_3c0 = local_3c0 + 4;
                local_3c8 = local_3c8 + 4;
              }
              for (; local_3cc < iVar1; local_3cc = local_3cc + 1) {
                *local_3b0 = *local_3a8;
                *local_3b8 = local_3a8[1];
                *local_3c0 = local_3a8[2];
                *local_3c8 = local_3a8[3];
                local_3a8 = local_3a8 + 4;
                local_3c8 = local_3c8 + 1;
                local_3c0 = local_3c0 + 1;
                local_3b8 = local_3b8 + 1;
                local_3b0 = local_3b0 + 1;
              }
            }
          }
          if ((iVar10 == 3) || (iVar10 == 4)) {
            if (iVar4 == 4) {
              for (local_45c = 0; local_45c < iVar3; local_45c = local_45c + 1) {
                this_00 = &local_4b0;
                ncnn::Mat::channel(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34);
                pfVar13 = ncnn::Mat::operator_cast_to_float_(this_00);
                ncnn::Mat::~Mat((Mat *)0x38bf47);
                local_468 = pfVar13;
                local_4c8 = ncnn::Mat::operator_cast_to_float_(in_RDX);
                local_4c8 = local_4c8 + iVar11 * local_45c * 4;
                local_4d0 = ncnn::Mat::operator_cast_to_float_(in_RDX);
                local_4d0 = local_4d0 + iVar11 * (local_45c * 4 + 1);
                local_4d8 = ncnn::Mat::operator_cast_to_float_(in_RDX);
                local_4d8 = local_4d8 + iVar11 * (local_45c * 4 + 2);
                local_4e0 = ncnn::Mat::operator_cast_to_float_(in_RDX);
                local_4e0 = local_4e0 + iVar11 * (local_45c * 4 + 3);
                for (local_4e4 = 0; local_4e4 + 3 < iVar11; local_4e4 = local_4e4 + 4) {
                  uVar6 = *(undefined8 *)(local_468 + 2);
                  uVar7 = *(undefined8 *)(local_468 + 8);
                  uVar8 = *(undefined8 *)(local_468 + 10);
                  local_2c8 = (undefined4)*(undefined8 *)local_468;
                  local_568 = local_2c8;
                  uStack_2c4 = (undefined4)((ulong)*(undefined8 *)local_468 >> 0x20);
                  local_2d8 = (undefined4)*(undefined8 *)(local_468 + 4);
                  uStack_564 = local_2d8;
                  uStack_2d4 = (undefined4)((ulong)*(undefined8 *)(local_468 + 4) >> 0x20);
                  uStack_2e4 = (undefined4)((ulong)uVar7 >> 0x20);
                  local_2f8 = (undefined4)*(undefined8 *)(local_468 + 0xc);
                  uStack_2f4 = (undefined4)((ulong)*(undefined8 *)(local_468 + 0xc) >> 0x20);
                  uStack_23c = (undefined4)((ulong)uVar6 >> 0x20);
                  uStack_250 = (undefined4)*(undefined8 *)(local_468 + 6);
                  uStack_24c = (undefined4)((ulong)*(undefined8 *)(local_468 + 6) >> 0x20);
                  uStack_25c = (undefined4)((ulong)uVar8 >> 0x20);
                  uStack_270 = (undefined4)*(undefined8 *)(local_468 + 0xe);
                  uStack_26c = (undefined4)((ulong)*(undefined8 *)(local_468 + 0xe) >> 0x20);
                  local_508 = CONCAT44(uStack_2d4,uStack_2c4);
                  uStack_500 = CONCAT44(uStack_2f4,uStack_2e4);
                  local_528 = CONCAT44(uStack_24c,uStack_23c);
                  uStack_520 = CONCAT44(uStack_26c,uStack_25c);
                  *(ulong *)local_4c8 = CONCAT44(local_2d8,local_2c8);
                  *(ulong *)(local_4c8 + 2) = CONCAT44(local_2f8,(int)uVar7);
                  *(undefined8 *)local_4d0 = local_508;
                  *(undefined8 *)(local_4d0 + 2) = uStack_500;
                  *(ulong *)local_4d8 = CONCAT44(uStack_250,(int)uVar6);
                  *(ulong *)(local_4d8 + 2) = CONCAT44(uStack_270,(int)uVar8);
                  *(undefined8 *)local_4e0 = local_528;
                  *(undefined8 *)(local_4e0 + 2) = uStack_520;
                  local_468 = local_468 + 0x10;
                  local_4c8 = local_4c8 + 4;
                  local_4d0 = local_4d0 + 4;
                  local_4d8 = local_4d8 + 4;
                  local_4e0 = local_4e0 + 4;
                }
                for (; local_4e4 < iVar11; local_4e4 = local_4e4 + 1) {
                  *local_4c8 = *local_468;
                  *local_4d0 = local_468[1];
                  *local_4d8 = local_468[2];
                  *local_4e0 = local_468[3];
                  local_468 = local_468 + 4;
                  local_4e0 = local_4e0 + 1;
                  local_4d8 = local_4d8 + 1;
                  local_4d0 = local_4d0 + 1;
                  local_4c8 = local_4c8 + 1;
                }
              }
            }
            if (iVar4 == 1) {
              for (local_56c = 0; local_56c < iVar3; local_56c = local_56c + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34);
                pfVar13 = ncnn::Mat::operator_cast_to_float_(&local_5c0);
                ncnn::Mat::~Mat((Mat *)0x38c591);
                local_578 = pfVar13;
                pfVar13 = ncnn::Mat::operator_cast_to_float_(in_RDX);
                in_stack_fffffffffffffa38 = (Mat *)(pfVar13 + iVar11 * local_56c);
                for (in_stack_fffffffffffffa34 = 0; in_stack_fffffffffffffa34 < iVar11;
                    in_stack_fffffffffffffa34 = in_stack_fffffffffffffa34 + 1) {
                  *(float *)&in_stack_fffffffffffffa38->data = *local_578;
                  in_stack_fffffffffffffa38 = (Mat *)((long)&in_stack_fffffffffffffa38->data + 4);
                  local_578 = local_578 + 1;
                }
              }
            }
          }
          local_33c = 0;
        }
      }
    }
  }
  return local_33c;
}

Assistant:

int Flatten_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}